

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QStyleSheetImageData>::detach_helper
          (QSharedDataPointer<QStyleSheetImageData> *this)

{
  QStyleSheetImageData *pQVar1;
  Representation RVar2;
  QStyleSheetImageData *pQVar3;
  
  pQVar3 = (QStyleSheetImageData *)operator_new(0x20);
  pQVar1 = (this->d).ptr;
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  QIcon::QIcon(&pQVar3->icon,&pQVar1->icon);
  (pQVar3->size).ht.m_i = (pQVar1->size).ht.m_i;
  RVar2.m_i = (pQVar1->size).wd.m_i;
  pQVar3->alignment =
       (QFlagsStorageHelper<Qt::AlignmentFlag,_4>)
       (pQVar1->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>;
  (pQVar3->size).wd = (Representation)RVar2.m_i;
  LOCK();
  (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    pQVar1 = (this->d).ptr;
    if (pQVar1 != (QStyleSheetImageData *)0x0) {
      QIcon::~QIcon(&pQVar1->icon);
    }
    operator_delete(pQVar1,0x20);
  }
  (this->d).ptr = pQVar3;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}